

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O2

vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> * __thiscall
cmGeneratorExpressionLexer::Tokenize
          (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           *__return_storage_ptr__,cmGeneratorExpressionLexer *this,string *input)

{
  char cVar1;
  char *upto;
  char *pcVar2;
  pointer c;
  cmGeneratorExpressionToken local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  upto = (input->_M_dataplus)._M_p;
  c = upto;
  do {
    cVar1 = *c;
    pcVar2 = c;
    if (cVar1 == '$') {
      if (c[1] == '<') {
        InsertText(upto,c,__return_storage_ptr__);
        local_38.TokenType = 1;
        local_38.Length = 2;
        local_38.Content = c;
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        emplace_back<cmGeneratorExpressionToken>(__return_storage_ptr__,&local_38);
        pcVar2 = c + 1;
        upto = c + 2;
        this->SawBeginExpression = true;
      }
    }
    else {
      if (cVar1 == ',') {
        InsertText(upto,c,__return_storage_ptr__);
        local_38.TokenType = 4;
        local_38.Length = 1;
        local_38.Content = c;
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        emplace_back<cmGeneratorExpressionToken>(__return_storage_ptr__,&local_38);
      }
      else {
        if (cVar1 != ':') {
          if (cVar1 == '>') {
            InsertText(upto,c,__return_storage_ptr__);
            local_38.TokenType = 2;
            local_38.Length = 1;
            local_38.Content = c;
            std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
            emplace_back<cmGeneratorExpressionToken>(__return_storage_ptr__,&local_38);
            upto = c + 1;
            this->SawGeneratorExpression = this->SawBeginExpression;
          }
          else if (cVar1 == '\0') {
            InsertText(upto,c,__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          goto LAB_003a22d6;
        }
        InsertText(upto,c,__return_storage_ptr__);
        local_38.TokenType = 3;
        local_38.Length = 1;
        local_38.Content = c;
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        emplace_back<cmGeneratorExpressionToken>(__return_storage_ptr__,&local_38);
      }
      upto = c + 1;
    }
LAB_003a22d6:
    c = pcVar2 + 1;
  } while( true );
}

Assistant:

std::vector<cmGeneratorExpressionToken>
cmGeneratorExpressionLexer::Tokenize(const std::string& input)
{
  std::vector<cmGeneratorExpressionToken> result;

  const char *c = input.c_str();
  const char *upto = c;

  for ( ; *c; ++c)
    {
    switch(*c)
      {
      case '$':
        if(c[1] == '<')
          {
          InsertText(upto, c, result);
          result.push_back(cmGeneratorExpressionToken(
                           cmGeneratorExpressionToken::BeginExpression, c, 2));
          upto = c + 2;
          ++c;
          SawBeginExpression = true;
          }
        break;
      case '>':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::EndExpression, c, 1));
        upto = c + 1;
        SawGeneratorExpression = SawBeginExpression;
        break;
      case ':':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::ColonSeparator, c, 1));
        upto = c + 1;
        break;
      case ',':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::CommaSeparator, c, 1));
        upto = c + 1;
        break;
      default:
        break;
      }
  }
  InsertText(upto, c, result);

  return result;
}